

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  undefined8 uVar1;
  Column *witness;
  Index columnIndex;
  bool bVar2;
  reference pvVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_598;
  basic_cstring<const_char> local_588;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_578;
  assertion_result local_558;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_500;
  assertion_result local_4e0;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_488;
  assertion_result local_468;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_410;
  assertion_result local_3f0;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_398;
  assertion_result local_378;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
  local_2c8;
  Column *local_298;
  Column *col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *c;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint i;
  size_type local_260;
  uint local_254;
  iterator local_250;
  size_type local_248;
  uint local_240 [2];
  iterator local_238;
  size_type local_230;
  uint local_228 [2];
  iterator local_220;
  size_type local_218;
  uint local_20c;
  iterator local_208;
  size_type local_200;
  uint local_1f4;
  iterator local_1f0;
  size_type local_1e8;
  uint local_1dc;
  iterator local_1d8;
  size_type local_1d0;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_1c1;
  undefined1 local_1c0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  undefined1 local_198 [8];
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>
              *)local_198,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_1c1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_1c0,7,&local_1c1);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_1c1);
  local_1dc = 0;
  local_1d8 = &local_1dc;
  local_1d0 = 1;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,0);
  __l_05._M_len = local_1d0;
  __l_05._M_array = local_1d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_05);
  local_1f4 = 1;
  local_1f0 = &local_1f4;
  local_1e8 = 1;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,1);
  __l_04._M_len = local_1e8;
  __l_04._M_array = local_1f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_04);
  local_20c = 2;
  local_208 = &local_20c;
  local_200 = 1;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,2);
  __l_03._M_len = local_200;
  __l_03._M_array = local_208;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_03);
  local_228[0] = 3;
  local_228[1] = 5;
  local_220 = local_228;
  local_218 = 2;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,3);
  __l_02._M_len = local_218;
  __l_02._M_array = local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_02);
  local_240[0] = 4;
  local_240[1] = 5;
  local_238 = local_240;
  local_230 = 2;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,4);
  __l_01._M_len = local_230;
  __l_01._M_array = local_238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_01);
  local_254 = 5;
  local_250 = &local_254;
  local_248 = 1;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,5);
  __l_00._M_len = local_248;
  __l_00._M_array = local_250;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l_00);
  __range1._4_4_ = 6;
  _i = (iterator)((long)&__range1 + 4);
  local_260 = 1;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)local_1c0,6);
  __l._M_len = local_260;
  __l._M_array = _i;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar3,__l);
  __range1._0_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_1c0);
  c = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1c0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&c), bVar2) {
    col = (Column *)
          __gnu_cxx::
          __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::operator*(&__end0);
    columnIndex = (Index)__range1;
    __range1._0_4_ = (Index)__range1 + 1;
    local_298 = Gudhi::persistence_matrix::
                Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                ::get_column((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                              *)local_198,columnIndex,false);
    witness = col;
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>>
              (&local_2c8,local_298);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false>>>>
              ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>_>_>
                *)witness,&local_2c8);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_2c8)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x296);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_entry((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                             *)local_198,3,5,false);
    boost::test_tools::assertion_result::assertion_result(&local_300,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"!m.is_zero_entry(3, 5, false)",0x1d);
    boost::unit_test::operator<<(&local_320,plVar4,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_300,&local_320,&local_340,0x296,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x297,&local_360);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_column((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                              *)local_198,4,false);
    boost::test_tools::assertion_result::assertion_result(&local_378,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a8,"!m.is_zero_column(4, false)",0x1b);
    boost::unit_test::operator<<(&local_398,plVar4,&local_3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_378,&local_398,&local_3b8,0x297,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_398);
    boost::test_tools::assertion_result::~assertion_result(&local_378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
  ::zero_entry((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                *)local_198,3,5,false);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c8,0x299);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_entry((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                             *)local_198,3,5,false);
    boost::test_tools::assertion_result::assertion_result(&local_3f0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,"m.is_zero_entry(3, 5, false)",0x1c);
    boost::unit_test::operator<<(&local_410,plVar4,&local_420);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3f0,&local_410,&local_430,0x299,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_410);
    boost::test_tools::assertion_result::~assertion_result(&local_3f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_450);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x29a,&local_450);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_column((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                              *)local_198,4,false);
    boost::test_tools::assertion_result::assertion_result(&local_468,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,"!m.is_zero_column(4, false)",0x1b);
    boost::unit_test::operator<<(&local_488,plVar4,&local_498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_468,&local_488,&local_4a8,0x29a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_488);
    boost::test_tools::assertion_result::~assertion_result(&local_468);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
  ::zero_column((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                 *)local_198,4,false);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b8,0x29c);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_entry((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                             *)local_198,3,5,false);
    boost::test_tools::assertion_result::assertion_result(&local_4e0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,"m.is_zero_entry(3, 5, false)",0x1c);
    boost::unit_test::operator<<(&local_500,plVar4,&local_510);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4e0,&local_500,&local_520,0x29c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_500);
    boost::test_tools::assertion_result::~assertion_result(&local_4e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_540);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_530,0x29d,&local_540);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
            ::is_zero_column((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
                              *)local_198,4,false);
    boost::test_tools::assertion_result::assertion_result(&local_558,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,"m.is_zero_column(4, false)",0x1a);
    boost::unit_test::operator<<(&local_578,plVar4,&local_588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_558,&local_578,&local_598,0x29d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_578);
    boost::test_tools::assertion_result::~assertion_result(&local_558);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1c0);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
  ::~Matrix((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false>_>
             *)local_198);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}